

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ech_calc_confirmation
              (ptls_key_schedule_t *sched,void *dst,uint8_t *inner_random,char *label,
              ptls_iovec_t message)

{
  ptls_hash_algorithm_t *ppVar1;
  st_ptls_hash_context_t *psVar2;
  ptls_iovec_t pVar3;
  ptls_iovec_t pVar4;
  int local_cc;
  undefined1 local_c8 [4];
  int ret;
  uint8_t transcript_hash [64];
  uint8_t secret [64];
  ptls_hash_context_t *hash;
  char *label_local;
  uint8_t *inner_random_local;
  void *dst_local;
  ptls_key_schedule_t *sched_local;
  ptls_iovec_t message_local;
  
  psVar2 = (*(sched->hashes[0].ctx)->clone_)(sched->hashes[0].ctx);
  if (psVar2 == (st_ptls_hash_context_t *)0x0) {
    local_cc = 0x201;
  }
  else {
    (*psVar2->update)(psVar2,message.base,message.len);
    (*psVar2->final)(psVar2,local_c8,PTLS_HASH_FINAL_MODE_FREE);
    ppVar1 = sched->hashes[0].algo;
    pVar3 = ptls_iovec_init((void *)0x0,0);
    pVar4 = ptls_iovec_init(inner_random,0x20);
    local_cc = ptls_hkdf_extract(ppVar1,transcript_hash + 0x38,pVar3,pVar4);
    if (local_cc == 0) {
      ppVar1 = sched->hashes[0].algo;
      pVar3 = ptls_iovec_init(transcript_hash + 0x38,(sched->hashes[0].algo)->digest_size);
      pVar4 = ptls_iovec_init(local_c8,(sched->hashes[0].algo)->digest_size);
      local_cc = ptls_hkdf_expand_label(ppVar1,dst,8,pVar3,label,pVar4,(char *)0x0);
    }
  }
  (*ptls_clear_memory)(transcript_hash + 0x38,0x40);
  (*ptls_clear_memory)(local_c8,0x40);
  return local_cc;
}

Assistant:

static int ech_calc_confirmation(ptls_key_schedule_t *sched, void *dst, const uint8_t *inner_random, const char *label,
                                 ptls_iovec_t message)
{
    ptls_hash_context_t *hash = NULL;
    uint8_t secret[PTLS_MAX_DIGEST_SIZE], transcript_hash[PTLS_MAX_DIGEST_SIZE];
    int ret;

    /* calc transcript hash using the modified ServerHello / HRR */
    if ((hash = sched->hashes[0].ctx->clone_(sched->hashes[0].ctx)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    hash->update(hash, message.base, message.len);
    hash->final(hash, transcript_hash, PTLS_HASH_FINAL_MODE_FREE);
    hash = NULL;

    /* HKDF extract and expand */
    if ((ret = ptls_hkdf_extract(sched->hashes[0].algo, secret, ptls_iovec_init(NULL, 0),
                                 ptls_iovec_init(inner_random, PTLS_HELLO_RANDOM_SIZE))) != 0)
        goto Exit;
    if ((ret = ptls_hkdf_expand_label(sched->hashes[0].algo, dst, 8, ptls_iovec_init(secret, sched->hashes[0].algo->digest_size),
                                      label, ptls_iovec_init(transcript_hash, sched->hashes[0].algo->digest_size), NULL)) != 0)
        goto Exit;

Exit:
    ptls_clear_memory(secret, sizeof(secret));
    ptls_clear_memory(transcript_hash, sizeof(transcript_hash));
    if (hash != NULL)
        hash->final(hash, NULL, PTLS_HASH_FINAL_MODE_FREE);
    return ret;
}